

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-from-pseudo-trace-type.cpp
# Opt level: O3

Up __thiscall
yactfr::internal::TraceTypeFromPseudoTraceTypeConverter::_traceTypeFromPseudoTraceType
          (TraceTypeFromPseudoTraceTypeConverter *this)

{
  PseudoDt *pseudoDt;
  _Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_> __fn;
  int __flags;
  undefined8 uVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  void *extraout_RDX_01;
  pointer *__ptr;
  PseudoDst *in_RSI;
  void *in_R8;
  _Head_base<0UL,_const_yactfr::TraceType_*,_false> _Var3;
  _Hash_node_base *p_Var4;
  PseudoTraceType *pseudoTraceType;
  undefined1 local_78 [8];
  undefined1 local_70 [12];
  uint local_64;
  __uniq_ptr_impl<const_yactfr::TraceType,_std::default_delete<const_yactfr::TraceType>_> local_60;
  DataStreamTypeSet dstSet;
  PseudoTraceType *pPVar2;
  
  PseudoTraceType::validate((PseudoTraceType *)in_RSI->_id);
  dstSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dstSet._M_t._M_impl.super__Rb_tree_header._M_header;
  dstSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar1 = 0;
  __flags = 0;
  dstSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dstSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pseudoTraceType = (PseudoTraceType *)in_RSI->_id;
  p_Var4 = (pseudoTraceType->_pseudoDsts)._M_h._M_before_begin._M_nxt;
  __child_stack = extraout_RDX;
  dstSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dstSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      _dstFromPseudoDst((TraceTypeFromPseudoTraceTypeConverter *)local_70,in_RSI);
      std::
      _Rb_tree<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,std::_Identity<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>,yactfr::internal::DstIdComp,std::allocator<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>>
      ::
      _M_insert_unique<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>
                ((_Rb_tree<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,std::_Identity<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>,yactfr::internal::DstIdComp,std::allocator<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>>
                  *)&dstSet,
                 (unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
                  *)local_70);
      std::
      unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>::
      ~unique_ptr((unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
                   *)local_70);
      __flags = (int)uVar1;
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
    pseudoTraceType = (PseudoTraceType *)in_RSI->_id;
    __child_stack = extraout_RDX_00;
  }
  local_64 = pseudoTraceType->_majorVersion;
  local_70._8_4_ = pseudoTraceType->_minorVersion;
  pseudoDt = (pseudoTraceType->_pseudoPktHeaderType)._M_t.
             super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
             ._M_t.
             super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
             .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if (pseudoDt == (PseudoDt *)0x0) {
    local_78 = (undefined1  [8])0x0;
    pPVar2 = pseudoTraceType;
  }
  else {
    in_R8 = (void *)0x0;
    pPVar2 = pseudoTraceType;
    dtFromPseudoRootDt((internal *)local_78,pseudoDt,PacketHeader,pseudoTraceType,(PseudoDst *)0x0,
                       (PseudoErt *)0x0);
    __flags = (int)pPVar2;
    __child_stack = extraout_RDX_01;
    pPVar2 = (PseudoTraceType *)in_RSI->_id;
  }
  __fn.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (pPVar2->super_WithAttrsMixin)._attrs._M_t.
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>;
  if (__fn.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl == (MapItem *)0x0) {
    _Var3._M_head_impl = (TraceType *)0x0;
  }
  else {
    MapItem::clone((MapItem *)local_70,
                   (__fn *)__fn.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl,
                   __child_stack,__flags,in_R8);
    _Var3._M_head_impl = (TraceType *)local_70._0_8_;
    local_70._0_8_ =
         (__uniq_ptr_impl<const_yactfr::TraceType,_std::default_delete<const_yactfr::TraceType>_>)
         0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_70);
  }
  local_60._M_t.
  super__Tuple_impl<0UL,_const_yactfr::TraceType_*,_std::default_delete<const_yactfr::TraceType>_>.
  super__Head_base<0UL,_const_yactfr::TraceType_*,_false>._M_head_impl =
       (tuple<const_yactfr::TraceType_*,_std::default_delete<const_yactfr::TraceType>_>)
       (tuple<const_yactfr::TraceType_*,_std::default_delete<const_yactfr::TraceType>_>)_Var3;
  std::
  make_unique<yactfr::TraceType_const,unsigned_int,unsigned_int,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,yactfr::TraceEnvironment_const&,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::set<std::unique_ptr<yactfr::ClockType_const,std::default_delete<yactfr::ClockType_const>>,yactfr::internal::ClkTypeAddrComp,std::allocator<std::unique_ptr<yactfr::ClockType_const,std::default_delete<yactfr::ClockType_const>>>>,std::set<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,yactfr::internal::DstIdComp,std::allocator<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)this,&local_64,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_70 + 8),&pseudoTraceType->_ns,&pseudoTraceType->_name,
             (TraceEnvironment *)&pseudoTraceType->_uid,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)&pseudoTraceType->_env,
             (set<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>,_yactfr::internal::ClkTypeAddrComp,_std::allocator<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>_>_>
              *)local_78,
             (set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
              *)&pPVar2->_clkTypes,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &dstSet);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_60);
  if (local_78 != (undefined1  [8])0x0) {
    std::default_delete<const_yactfr::StructureType>::operator()
              ((default_delete<const_yactfr::StructureType> *)local_78,(StructureType *)local_78);
  }
  std::
  _Rb_tree<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_std::_Identity<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
  ::~_Rb_tree(&dstSet._M_t);
  return (__uniq_ptr_data<const_yactfr::TraceType,_std::default_delete<const_yactfr::TraceType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::TraceType,_std::default_delete<const_yactfr::TraceType>,_true,_true>
            )this;
}

Assistant:

TraceType::Up TraceTypeFromPseudoTraceTypeConverter::_traceTypeFromPseudoTraceType()
{
    // validate first
    _pseudoTraceType->validate();

    DataStreamTypeSet dstSet;

    for (auto& idPseudoDstPair : _pseudoTraceType->pseudoDsts()) {
        dstSet.insert(this->_dstFromPseudoDst(*idPseudoDstPair.second));
    }

    // create yactfr trace type
    return TraceType::create(_pseudoTraceType->majorVersion(), _pseudoTraceType->minorVersion(),
                             _pseudoTraceType->ns(), _pseudoTraceType->name(),
                             _pseudoTraceType->uid(), _pseudoTraceType->env(),
                             this->_scopeStructTypeFromPseudoDt(_pseudoTraceType->pseudoPktHeaderType(),
                                                                Scope::PacketHeader),
                             std::move(_pseudoTraceType->clkTypes()), std::move(dstSet),
                             tryCloneAttrs(_pseudoTraceType->attrs()));
}